

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

int64_t r_code::Utils::GetResilience(uint64_t now,uint64_t time_to_live,uint64_t upr)

{
  undefined8 local_40;
  uint64_t next_upr;
  uint64_t last_upr;
  uint64_t deadline;
  uint64_t upr_local;
  uint64_t time_to_live_local;
  uint64_t now_local;
  
  if ((time_to_live == 0) || (upr == 0)) {
    now_local = 1;
  }
  else {
    local_40 = ((now + time_to_live) - TimeReference) / upr;
    if (((now + time_to_live) - TimeReference) % upr != 0) {
      local_40 = local_40 + 1;
    }
    now_local = local_40 - (now - TimeReference) / upr;
  }
  return now_local;
}

Assistant:

int64_t Utils::GetResilience(uint64_t now, uint64_t time_to_live, uint64_t upr)
{
    if (time_to_live == 0 || upr == 0) {
        return 1;
    }

    uint64_t deadline = now + time_to_live;
    uint64_t last_upr = (now - TimeReference) / upr;
    uint64_t next_upr = (deadline - TimeReference) / upr;

    if ((deadline - TimeReference) % upr > 0) {
        ++next_upr;
    }

    return next_upr - last_upr;
}